

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_IterateLoadLevelFaces(ktxTexture1 *This,PFNKTXITERCB iterCb,void *userdata)

{
  uint uVar1;
  byte bVar2;
  undefined8 in_RDX;
  code *in_RSI;
  int *in_RDI;
  GLsizei depth;
  GLsizei height;
  GLsizei width;
  ktx_uint32_t innerIterations;
  ktx_uint32_t face;
  ktx_uint32_t faceLodSizePadded;
  ktx_uint32_t faceLodSize;
  void *data;
  ktx_error_code_e result;
  ktx_uint32_t miplevel;
  ktx_uint32_t dataSize;
  ktxStream *stream;
  ktxTexture_protected *prtctd;
  ktxTexture1_private *private;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_60;
  uint local_5c;
  uint local_54;
  khronos_uint32_t *local_50;
  ktx_error_code_e local_44;
  uint local_40;
  uint local_3c;
  undefined8 *local_38;
  long local_30;
  byte *local_28;
  undefined8 local_20;
  code *local_18;
  int *local_10;
  ktx_error_code_e local_4;
  
  local_28 = *(byte **)(in_RDI + 0x22);
  local_30 = *(long *)(in_RDI + 6);
  local_38 = (undefined8 *)(local_30 + 0x40);
  local_3c = 0;
  local_44 = KTX_SUCCESS;
  local_50 = (khronos_uint32_t *)0x0;
  if (in_RDI == (int *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (*in_RDI == 1) {
    if (in_RSI == (code *)0x0) {
      local_4 = KTX_INVALID_VALUE;
    }
    else if (*(long *)(local_30 + 0x80) == 0) {
      local_4 = KTX_INVALID_OPERATION;
    }
    else {
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      for (local_40 = 0; local_40 < (uint)local_10[0xd]; local_40 = local_40 + 1) {
        bVar2 = (byte)local_40;
        if ((uint)local_10[9] >> (bVar2 & 0x1f) == 0) {
          local_70 = 1;
        }
        else {
          local_70 = (uint)local_10[9] >> (bVar2 & 0x1f);
        }
        if ((uint)local_10[10] >> (bVar2 & 0x1f) == 0) {
          local_74 = 1;
        }
        else {
          local_74 = (uint)local_10[10] >> (bVar2 & 0x1f);
        }
        if ((uint)local_10[0xb] >> (bVar2 & 0x1f) == 0) {
          local_78 = 1;
        }
        else {
          local_78 = (uint)local_10[0xb] >> (bVar2 & 0x1f);
        }
        local_44 = (*(code *)*local_38)(local_38,&local_54,4);
        if (local_44 != KTX_SUCCESS) break;
        if ((*local_28 & 1) != 0) {
          _ktxSwapEndian32(&local_54,1);
        }
        uVar1 = local_54;
        if (local_50 == (khronos_uint32_t *)0x0) {
          local_50 = (khronos_uint32_t *)malloc((ulong)local_54);
          if (local_50 == (khronos_uint32_t *)0x0) {
            local_44 = KTX_OUT_OF_MEMORY;
            break;
          }
          local_3c = uVar1;
        }
        else if (local_3c < local_54) {
          local_44 = KTX_FILE_DATA_ERROR;
          break;
        }
        if (((*(byte *)((long)local_10 + 0x21) & 1) == 0) || ((*(byte *)(local_10 + 8) & 1) != 0)) {
          local_60 = 1;
        }
        else {
          local_60 = local_10[0xf];
        }
        for (local_5c = 0; local_5c < local_60; local_5c = local_5c + 1) {
          local_44 = (*(code *)*local_38)(local_38,local_50,uVar1);
          if (local_44 != KTX_SUCCESS) goto LAB_00412caa;
          if ((*local_28 & 1) != 0) {
            if (*(int *)(local_30 + 0x38) == 2) {
              _ktxSwapEndian16((khronos_uint16_t *)local_50,(ulong)(local_54 >> 1));
            }
            else if (*(int *)(local_30 + 0x38) == 4) {
              _ktxSwapEndian32(local_50,(ulong)(local_54 >> 2));
            }
          }
          local_44 = (*local_18)(local_40,local_5c,local_70,local_74,local_78,local_54,local_50,
                                 local_20);
        }
      }
LAB_00412caa:
      free(local_50);
      (*(code *)local_38[6])(local_38);
      local_4 = local_44;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture1_IterateLoadLevelFaces(ktxTexture1* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PRIVATE(ktxTexture1);
    struct ktxTexture_protected* prtctd = This->_protected;
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktx_uint32_t    dataSize = 0;
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;
    void*           data = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture1_c)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t faceLodSizePadded;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (result != KTX_SUCCESS) {
            goto cleanup;
        }
        if (private->_needSwap) {
            _ktxSwapEndian32(&faceLodSize, 1);
        }
#if (KTX_GL_UNPACK_ALIGNMENT != 4)
        faceLodSizePadded = _KTX_PAD4(faceLodSize);
#else
        faceLodSizePadded = faceLodSize;
#endif
        if (!data) {
            /* allocate memory sufficient for the base miplevel */
            data = malloc(faceLodSizePadded);
            if (!data) {
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
            }
            dataSize = faceLodSizePadded;
        }
        else if (dataSize < faceLodSizePadded) {
            /* subsequent miplevels cannot be larger than the base miplevel */
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (z_slice = 0; z_slice < This->depth)
             */
            result = stream->read(stream, data, faceLodSizePadded);
            if (result != KTX_SUCCESS) {
                goto cleanup;
            }

            /* Perform endianness conversion on texture data */
            if (private->_needSwap) {
                if (prtctd->_typeSize == 2)
                    _ktxSwapEndian16((ktx_uint16_t*)data, faceLodSize / 2);
                else if (prtctd->_typeSize == 4)
                    _ktxSwapEndian32((ktx_uint32_t*)data, faceLodSize / 4);
            }

            result = iterCb(miplevel, face,
                             width, height, depth,
                             faceLodSize, data, userdata);
        }
    }

cleanup:
    free(data);
    // No further need for this.
    stream->destruct(stream);

    return result;
}